

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SaturationAlgorithm.cpp
# Opt level: O0

LiteralSelector * __thiscall
Saturation::SaturationAlgorithm::getSosLiteralSelector(SaturationAlgorithm *this)

{
  bool bVar1;
  Sos SVar2;
  Ordering *ordering;
  TotalLiteralSelector *this_00;
  Options *options;
  LiteralSelector *pLVar3;
  MainLoop *in_RDI;
  LiteralSelector *in_stack_ffffffffffffffb8;
  
  SVar2 = Shell::Options::sos(in_RDI->_opt);
  if ((SVar2 != ALL) && (SVar2 = Shell::Options::sos(in_RDI->_opt), SVar2 != THEORY)) {
    pLVar3 = Lib::ScopedPtr<Kernel::LiteralSelector>::operator*
                       ((ScopedPtr<Kernel::LiteralSelector> *)&in_RDI[8]._prb);
    return pLVar3;
  }
  bVar1 = Lib::ScopedPtr::operator_cast_to_bool((ScopedPtr *)&in_RDI[0xc]._opt);
  if (!bVar1) {
    ordering = (Ordering *)::operator_new(0x20);
    this_00 = (TotalLiteralSelector *)getOrdering((SaturationAlgorithm *)0xad03d6);
    options = Kernel::MainLoop::getOptions(in_RDI);
    Kernel::TotalLiteralSelector::TotalLiteralSelector(this_00,ordering,options);
    Lib::ScopedPtr<Kernel::LiteralSelector>::operator=
              ((ScopedPtr<Kernel::LiteralSelector> *)options,in_stack_ffffffffffffffb8);
  }
  pLVar3 = Lib::ScopedPtr<Kernel::LiteralSelector>::operator*
                     ((ScopedPtr<Kernel::LiteralSelector> *)&in_RDI[0xc]._opt);
  return pLVar3;
}

Assistant:

LiteralSelector& SaturationAlgorithm::getSosLiteralSelector()
{
  if (_opt.sos() == Options::Sos::ALL || _opt.sos() == Options::Sos::THEORY) {
    if (!_sosLiteralSelector) {
      _sosLiteralSelector = new TotalLiteralSelector(getOrdering(), getOptions());
    }
    return *_sosLiteralSelector;
  }
  else {
    return *_selector;
  }
}